

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaBalAig.c
# Opt level: O0

void Dam_ManCreatePairs(Dam_Man_t *p,int fVerbose)

{
  Vec_Int_t *pVVar1;
  Dam_Man_t *p_00;
  int iVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  int iLit1;
  int LevR;
  Vec_Int_t *p_01;
  Vec_Int_t *p_02;
  Hash_IntMan_t *pHVar6;
  Vec_Flt_t *pVVar7;
  Vec_Que_t *pVVar8;
  float **pCosts;
  Vec_Int_t *pVVar9;
  int *piVar10;
  bool bVar11;
  uint local_a4;
  uint local_a0;
  int nDivsXor;
  int nDivsUsed;
  int nDivsAll;
  int nPairsXor;
  int nPairsUsed;
  int nPairsTried;
  int nPairsAll;
  int *pSet;
  int local_78;
  int iDiv;
  int iNode;
  int nRefs;
  int FanJ;
  int FanK;
  int Num;
  int k;
  int j;
  int i;
  Vec_Int_t *vLevRMax;
  Vec_Int_t *vRemap;
  Vec_Int_t *vDivs;
  Vec_Int_t *vSuper;
  Vec_Int_t *vRefsXor;
  Vec_Int_t *vRefsAnd;
  Hash_IntMan_t *vHash;
  Gia_Obj_t *pObj;
  Dam_Man_t *pDStack_10;
  int fVerbose_local;
  Dam_Man_t *p_local;
  
  nPairsUsed = 0;
  nPairsXor = 0;
  nDivsAll = 0;
  nDivsUsed = 0;
  local_a0 = 0;
  local_a4 = 0;
  pObj._4_4_ = fVerbose;
  pDStack_10 = p;
  Dam_ManCollectSets(p);
  pVVar9 = pDStack_10->pGia->vSuper;
  iVar2 = Gia_ManObjNum(pDStack_10->pGia);
  p_01 = Vec_IntAlloc(iVar2);
  iVar2 = Gia_ManObjNum(pDStack_10->pGia);
  vRefsAnd = (Vec_Int_t *)Hash_IntManStart(iVar2 / 2);
  p_02 = Vec_IntStart(1000);
  Dam_ManCreateMultiRefs(pDStack_10,&vRefsXor,&vSuper);
  k = 0;
  while( true ) {
    bVar11 = false;
    if (k < pDStack_10->pGia->nObjs) {
      vHash = (Hash_IntMan_t *)Gia_ManObj(pDStack_10->pGia,k);
      bVar11 = vHash != (Hash_IntMan_t *)0x0;
    }
    if (!bVar11) break;
    iVar2 = Gia_ObjIsAnd((Gia_Obj_t *)vHash);
    if ((iVar2 != 0) && (iVar2 = Dam_ObjHand(pDStack_10,k), iVar2 != 0)) {
      piVar10 = Dam_ObjSet(pDStack_10,k);
      nPairsUsed = (*piVar10 * (*piVar10 + -1)) / 2 + nPairsUsed;
      Vec_IntClear(pVVar9);
      iVar2 = Gia_ObjIsXor((Gia_Obj_t *)vHash);
      if (iVar2 == 0) {
        iVar2 = Gia_ObjIsAndReal(pDStack_10->pGia,(Gia_Obj_t *)vHash);
        if (iVar2 == 0) {
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaBalAig.c"
                        ,0x270,"void Dam_ManCreatePairs(Dam_Man_t *, int)");
        }
        for (FanK = 1; FanK <= *piVar10; FanK = FanK + 1) {
          iVar2 = Vec_IntEntry(vRefsXor,piVar10[FanK]);
          if (1 < iVar2) {
            Vec_IntPush(pVVar9,piVar10[FanK]);
          }
        }
      }
      else {
        for (FanK = 1; pVVar1 = vSuper, FanK <= *piVar10; FanK = FanK + 1) {
          iVar2 = Abc_Lit2Var(piVar10[FanK]);
          iVar2 = Vec_IntEntry(pVVar1,iVar2);
          if (1 < iVar2) {
            Vec_IntPush(pVVar9,piVar10[FanK]);
          }
        }
      }
      iVar2 = Vec_IntSize(pVVar9);
      if (1 < iVar2) {
        iVar2 = Vec_IntSize(pVVar9);
        iVar4 = Vec_IntSize(pVVar9);
        nPairsXor = (iVar2 * (iVar4 + -1)) / 2 + nPairsXor;
        Vec_IntPush(p_01,-k);
        for (FanK = 0; iVar2 = Vec_IntSize(pVVar9), FanK < iVar2; FanK = FanK + 1) {
          iVar2 = Vec_IntEntry(pVVar9,FanK);
          Num = FanK;
          while( true ) {
            Num = Num + 1;
            iVar4 = Vec_IntSize(pVVar9);
            if (iVar4 <= Num) break;
            iVar4 = Vec_IntEntry(pVVar9,Num);
            uVar3 = Gia_ObjIsXor((Gia_Obj_t *)vHash);
            if (iVar4 < iVar2 == uVar3) {
              FanJ = Hash_Int2ManInsert((Hash_IntMan_t *)vRefsAnd,iVar2,iVar4,0);
            }
            else {
              FanJ = Hash_Int2ManInsert((Hash_IntMan_t *)vRefsAnd,iVar4,iVar2,0);
            }
            iVar4 = Hash_Int2ObjInc((Hash_IntMan_t *)vRefsAnd,FanJ);
            if (iVar4 == 1) {
              local_a0 = local_a0 + 1;
              iVar4 = Gia_ObjIsXor((Gia_Obj_t *)vHash);
              local_a4 = iVar4 + local_a4;
            }
            Vec_IntPush(p_01,FanJ);
            iVar4 = Vec_IntSize(p_02);
            if (iVar4 <= FanJ) {
              iVar4 = Vec_IntSize(p_02);
              Vec_IntFillExtra(p_02,(iVar4 * 3) / 2,0);
            }
            iVar4 = Vec_IntEntry(pDStack_10->vNodLevR,k);
            Vec_IntUpdateEntry(p_02,FanJ,iVar4);
          }
        }
      }
    }
    k = k + 1;
  }
  Vec_IntFree(vRefsXor);
  Vec_IntFree(vSuper);
  pHVar6 = Hash_IntManStart((int)(local_a0 * 3) / 2);
  pDStack_10->vHash = pHVar6;
  pVVar7 = Vec_FltAlloc(local_a0 << 1);
  pDStack_10->vCounts = pVVar7;
  Vec_FltPush(pDStack_10->vCounts,1e+09);
  iVar2 = Vec_FltCap(pDStack_10->vCounts);
  pVVar8 = Vec_QueAlloc(iVar2);
  pDStack_10->vQue = pVVar8;
  pVVar8 = pDStack_10->vQue;
  pCosts = Vec_FltArrayP(pDStack_10->vCounts);
  Vec_QueSetPriority(pVVar8,pCosts);
  pVVar9 = Vec_IntAlloc(local_a0 << 1);
  pDStack_10->vDiv2Nod = pVVar9;
  Vec_IntPush(pDStack_10->vDiv2Nod,1000000000);
  iVar2 = Gia_ManObjNum(pDStack_10->pGia);
  pVVar9 = Vec_IntAlloc(iVar2);
  pDStack_10->vNodStore = pVVar9;
  Vec_IntPush(pDStack_10->vNodStore,-1);
  uVar3 = Hash_IntManEntryNum((Hash_IntMan_t *)vRefsAnd);
  pVVar9 = Vec_IntStartFull(uVar3 + 1);
  k = 1;
  do {
    if ((int)uVar3 < k) {
      iVar2 = Vec_FltSize(pDStack_10->vCounts);
      iVar4 = Hash_IntManEntryNum(pDStack_10->vHash);
      if (iVar2 != iVar4 + 1) {
        __assert_fail("Vec_FltSize(p->vCounts) == Hash_IntManEntryNum(p->vHash)+1",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaBalAig.c"
                      ,0x2ab,"void Dam_ManCreatePairs(Dam_Man_t *, int)");
      }
      iVar2 = Vec_IntSize(pDStack_10->vDiv2Nod);
      if (iVar2 == local_a0 + 1) {
        Hash_IntManStop((Hash_IntMan_t *)vRefsAnd);
        Vec_IntFree(p_02);
        local_78 = -1;
        for (k = 0; iVar2 = Vec_IntSize(p_01), k < iVar2; k = k + 1) {
          iVar2 = Vec_IntEntry(p_01,k);
          if (iVar2 < 0) {
            local_78 = -iVar2;
          }
          else {
            iVar2 = Vec_IntEntry(pVVar9,iVar2);
            if (iVar2 != -1) {
              piVar10 = Dam_DivSet(pDStack_10,iVar2);
              iVar2 = *piVar10;
              *piVar10 = iVar2 + 1;
              piVar10[iVar2 + 1] = local_78;
            }
          }
        }
        Vec_IntFree(pVVar9);
        Vec_IntFree(p_01);
        pVVar9 = Vec_IntStart(local_a0 << 1);
        pDStack_10->vDivLevR = pVVar9;
        if (pObj._4_4_ != 0) {
          printf("Pairs:");
          iVar2 = Abc_MaxInt(nPairsUsed,1);
          printf("  Total =%9d (%6.2f %%)",((double)nPairsUsed * 100.0) / (double)iVar2,
                 (ulong)(uint)nPairsUsed);
          iVar2 = Abc_MaxInt(nPairsUsed,1);
          printf("  Tried =%9d (%6.2f %%)",((double)nPairsXor * 100.0) / (double)iVar2,
                 (ulong)(uint)nPairsXor);
          iVar2 = Abc_MaxInt(nPairsUsed,1);
          printf("  Used =%9d (%6.2f %%)",((double)nDivsAll * 100.0) / (double)iVar2,
                 (ulong)(uint)nDivsAll);
          iVar2 = Abc_MaxInt(nPairsUsed,1);
          printf("  Xor =%9d (%6.2f %%)",((double)nDivsUsed * 100.0) / (double)iVar2,
                 (ulong)(uint)nDivsUsed);
          printf("\n");
          printf("Div:  ");
          iVar2 = Abc_MaxInt(uVar3,1);
          printf("  Total =%9d (%6.2f %%)",((double)(int)uVar3 * 100.0) / (double)iVar2,(ulong)uVar3
                );
          iVar2 = Abc_MaxInt(uVar3,1);
          printf("  Tried =%9d (%6.2f %%)",((double)(int)uVar3 * 100.0) / (double)iVar2,(ulong)uVar3
                );
          iVar2 = Abc_MaxInt(uVar3,1);
          printf("  Used =%9d (%6.2f %%)",((double)(int)local_a0 * 100.0) / (double)iVar2,
                 (ulong)local_a0);
          iVar2 = Abc_MaxInt(uVar3,1);
          printf("  Xor =%9d (%6.2f %%)",((double)(int)local_a4 * 100.0) / (double)iVar2,
                 (ulong)local_a4);
          printf("\n");
        }
        return;
      }
      __assert_fail("Vec_IntSize(p->vDiv2Nod) == nDivsUsed+1",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaBalAig.c"
                    ,0x2ac,"void Dam_ManCreatePairs(Dam_Man_t *, int)");
    }
    iVar2 = Hash_IntObjData2((Hash_IntMan_t *)vRefsAnd,k);
    if (1 < iVar2) {
      nDivsAll = iVar2 + nDivsAll;
      iVar4 = Hash_IntObjData0((Hash_IntMan_t *)vRefsAnd,k);
      iVar5 = Hash_IntObjData1((Hash_IntMan_t *)vRefsAnd,k);
      if (iVar5 < iVar4) {
        nDivsUsed = iVar2 + nDivsUsed;
      }
      pHVar6 = pDStack_10->vHash;
      iVar4 = Hash_IntObjData0((Hash_IntMan_t *)vRefsAnd,k);
      iVar5 = Hash_IntObjData1((Hash_IntMan_t *)vRefsAnd,k);
      iVar4 = Hash_Int2ManInsert(pHVar6,iVar4,iVar5,0);
      iVar5 = Hash_IntManEntryNum(pDStack_10->vHash);
      if (iVar4 != iVar5) {
        __assert_fail("Num == Hash_IntManEntryNum(p->vHash)",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaBalAig.c"
                      ,0x29f,"void Dam_ManCreatePairs(Dam_Man_t *, int)");
      }
      iVar5 = Vec_FltSize(pDStack_10->vCounts);
      p_00 = pDStack_10;
      if (iVar4 != iVar5) {
        __assert_fail("Num == Vec_FltSize(p->vCounts)",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaBalAig.c"
                      ,0x2a0,"void Dam_ManCreatePairs(Dam_Man_t *, int)");
      }
      pVVar7 = pDStack_10->vCounts;
      iVar5 = Hash_IntObjData0((Hash_IntMan_t *)vRefsAnd,k);
      iLit1 = Hash_IntObjData1((Hash_IntMan_t *)vRefsAnd,k);
      LevR = Vec_IntEntry(p_02,k);
      iVar5 = Dam_ManDivSlack(p_00,iVar5,iLit1,LevR);
      Vec_FltPush(pVVar7,(float)iVar5 * 0.005 + (float)iVar2);
      Vec_QuePush(pDStack_10->vQue,iVar4);
      iVar5 = Vec_IntSize(pDStack_10->vDiv2Nod);
      if (iVar4 != iVar5) {
        __assert_fail("Num == Vec_IntSize(p->vDiv2Nod)",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaBalAig.c"
                      ,0x2a4,"void Dam_ManCreatePairs(Dam_Man_t *, int)");
      }
      pVVar1 = pDStack_10->vDiv2Nod;
      iVar5 = Vec_IntSize(pDStack_10->vNodStore);
      Vec_IntPush(pVVar1,iVar5);
      Vec_IntPush(pDStack_10->vNodStore,0);
      pVVar1 = pDStack_10->vNodStore;
      iVar5 = Vec_IntSize(pDStack_10->vNodStore);
      Vec_IntFillExtra(pVVar1,iVar5 + iVar2,-1);
      Vec_IntWriteEntry(pVVar9,k,iVar4);
    }
    k = k + 1;
  } while( true );
}

Assistant:

void Dam_ManCreatePairs( Dam_Man_t * p, int fVerbose )
{
    Gia_Obj_t * pObj;
    Hash_IntMan_t * vHash;
    Vec_Int_t * vRefsAnd, * vRefsXor, * vSuper, * vDivs, * vRemap, * vLevRMax;
    int i, j, k, Num, FanK, FanJ, nRefs, iNode, iDiv, * pSet;
    int nPairsAll = 0, nPairsTried = 0, nPairsUsed = 0, nPairsXor = 0;
    int nDivsAll = 0, nDivsUsed = 0, nDivsXor = 0;
    Dam_ManCollectSets( p );
    vSuper = p->pGia->vSuper;
    vDivs  = Vec_IntAlloc( Gia_ManObjNum(p->pGia) );
    vHash  = Hash_IntManStart( Gia_ManObjNum(p->pGia)/2 );
    vLevRMax = Vec_IntStart( 1000 );
    Dam_ManCreateMultiRefs( p, &vRefsAnd, &vRefsXor );
    Gia_ManForEachAnd( p->pGia, pObj, i )
    {
        if ( !Dam_ObjHand(p, i) )
            continue;
        pSet = Dam_ObjSet(p, i);
        nPairsAll += pSet[0] * (pSet[0] - 1) / 2;
        Vec_IntClear(vSuper);
        if ( Gia_ObjIsXor(pObj) )
        {
            for ( k = 1; k <= pSet[0]; k++ )
                if ( Vec_IntEntry(vRefsXor, Abc_Lit2Var(pSet[k])) > 1 )
                    Vec_IntPush( vSuper, pSet[k] );
        }
        else if ( Gia_ObjIsAndReal(p->pGia, pObj) )
        {
            for ( k = 1; k <= pSet[0]; k++ )
                if ( Vec_IntEntry(vRefsAnd, pSet[k]) > 1 )
                    Vec_IntPush( vSuper, pSet[k] );
        }
        else assert( 0 );
        if ( Vec_IntSize(vSuper) < 2 )
            continue;
        // enumerate pairs
        nPairsTried += Vec_IntSize(vSuper) * (Vec_IntSize(vSuper) - 1) / 2;
        Vec_IntPush( vDivs, -i ); // remember node
        Vec_IntForEachEntry( vSuper, FanK, k )
        Vec_IntForEachEntryStart( vSuper, FanJ, j, k+1 )
        {
            if ( (FanK > FanJ) ^ Gia_ObjIsXor(pObj) )
                Num = Hash_Int2ManInsert( vHash, FanJ, FanK, 0 );
            else
                Num = Hash_Int2ManInsert( vHash, FanK, FanJ, 0 );
            if ( Hash_Int2ObjInc( vHash, Num ) == 1 )
            {
                nDivsUsed++;
                nDivsXor += Gia_ObjIsXor(pObj);
            }
            Vec_IntPush( vDivs, Num ); // remember devisor
            // update reverse level
            if ( Num >= Vec_IntSize(vLevRMax) )
                Vec_IntFillExtra( vLevRMax, 3 * Vec_IntSize(vLevRMax) / 2, 0 );
            Vec_IntUpdateEntry( vLevRMax, Num, Vec_IntEntry(p->vNodLevR, i) );
        }
    }
    Vec_IntFree( vRefsAnd );
    Vec_IntFree( vRefsXor );
//    Hash_IntManProfile( vHash );
    // remove entries that appear only once
    p->vHash     = Hash_IntManStart( 3 * nDivsUsed /2 );
    p->vCounts   = Vec_FltAlloc( 2 * nDivsUsed );           Vec_FltPush( p->vCounts, ABC_INFINITY );
    p->vQue      = Vec_QueAlloc( Vec_FltCap(p->vCounts) );
    Vec_QueSetPriority( p->vQue, Vec_FltArrayP(p->vCounts) );
    // mapping div to node
    p->vDiv2Nod  = Vec_IntAlloc( 2 * nDivsUsed );           Vec_IntPush( p->vDiv2Nod, ABC_INFINITY );
    p->vNodStore = Vec_IntAlloc( Gia_ManObjNum(p->pGia) );  Vec_IntPush( p->vNodStore, -1 );
    nDivsAll     = Hash_IntManEntryNum(vHash);
    vRemap       = Vec_IntStartFull( nDivsAll+1 );
    for ( i = 1; i <= nDivsAll; i++ )
    {
        nRefs = Hash_IntObjData2(vHash, i);
        if ( nRefs < 2 )
            continue;
        nPairsUsed += nRefs;
        if ( Hash_IntObjData0(vHash, i) > Hash_IntObjData1(vHash, i) )
            nPairsXor += nRefs; 
        Num = Hash_Int2ManInsert( p->vHash, Hash_IntObjData0(vHash, i), Hash_IntObjData1(vHash, i), 0 );
        assert( Num == Hash_IntManEntryNum(p->vHash) );
        assert( Num == Vec_FltSize(p->vCounts) );
        Vec_FltPush( p->vCounts, nRefs + 0.005*Dam_ManDivSlack(p, Hash_IntObjData0(vHash, i), Hash_IntObjData1(vHash, i), Vec_IntEntry(vLevRMax, i)) );
        Vec_QuePush( p->vQue, Num );
        // remember divisors
        assert( Num == Vec_IntSize(p->vDiv2Nod) );
        Vec_IntPush( p->vDiv2Nod, Vec_IntSize(p->vNodStore) );
        Vec_IntPush( p->vNodStore, 0 );
        Vec_IntFillExtra( p->vNodStore, Vec_IntSize(p->vNodStore) + nRefs, -1 );
        // remember entry
        Vec_IntWriteEntry( vRemap, i, Num );
    }
    assert( Vec_FltSize(p->vCounts) == Hash_IntManEntryNum(p->vHash)+1 );
    assert( Vec_IntSize(p->vDiv2Nod) == nDivsUsed+1 );
    Hash_IntManStop( vHash );
    Vec_IntFree( vLevRMax );
    // fill in the divisors
    iNode = -1;
    Vec_IntForEachEntry( vDivs, iDiv, i )
    {
        if ( iDiv < 0 )
        {
            iNode = -iDiv;
            continue;
        }
        Num = Vec_IntEntry( vRemap, iDiv );
        if ( Num == -1 )
            continue;
        pSet = Dam_DivSet( p, Num );
        pSet[++pSet[0]] = iNode;
    }
    Vec_IntFree( vRemap );
    Vec_IntFree( vDivs );
    // create storage for reverse level of divisor during update
    p->vDivLevR = Vec_IntStart( 2 * nDivsUsed );
    // make sure divisors are added correctly
//    for ( i = 1; i <= nDivsUsed; i++ )
//        assert( Dam_DivSet(p, i)[0] == Vec_FltEntry(p->vCounts, i)+1 );
    if ( !fVerbose )
        return;
    // print stats
    printf( "Pairs:" );
    printf( "  Total =%9d (%6.2f %%)", nPairsAll,   100.0 * nPairsAll   / Abc_MaxInt(nPairsAll, 1) );
    printf( "  Tried =%9d (%6.2f %%)", nPairsTried, 100.0 * nPairsTried / Abc_MaxInt(nPairsAll, 1) );
    printf( "  Used =%9d (%6.2f %%)",  nPairsUsed,  100.0 * nPairsUsed  / Abc_MaxInt(nPairsAll, 1) );
    printf( "  Xor =%9d (%6.2f %%)",   nPairsXor,   100.0 * nPairsXor   / Abc_MaxInt(nPairsAll, 1) );
    printf( "\n" );
    printf( "Div:  " );
    printf( "  Total =%9d (%6.2f %%)", nDivsAll,    100.0 * nDivsAll    / Abc_MaxInt(nDivsAll, 1) );
    printf( "  Tried =%9d (%6.2f %%)", nDivsAll,    100.0 * nDivsAll    / Abc_MaxInt(nDivsAll, 1) );
    printf( "  Used =%9d (%6.2f %%)",  nDivsUsed,   100.0 * nDivsUsed   / Abc_MaxInt(nDivsAll, 1) );
    printf( "  Xor =%9d (%6.2f %%)",   nDivsXor,    100.0 * nDivsXor    / Abc_MaxInt(nDivsAll, 1) );
    printf( "\n" );
}